

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

bool __thiscall
ExternalTester::testGlobalRule
          (ExternalTester *this,BaseFunction *f,TypeOneDRule rule,int *anisotropic,double alpha,
          double beta,vector<TestType,_std::allocator<TestType>_> *tests,int *depths,double *tols)

{
  double dVar1;
  int *custom_filename_00;
  TypeDepth TVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  _Setw _Var8;
  int iVar9;
  size_type sVar10;
  reference pvVar11;
  const_reference pvVar12;
  ostream *poVar13;
  undefined4 extraout_var;
  void *pvVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeOneDRule rule_00;
  TypeOneDRule rule_01;
  TypeOneDRule rule_02;
  char *pcVar15;
  TestResults TVar16;
  int local_670;
  int *local_668;
  string local_630;
  int local_610;
  int local_60c;
  double local_608;
  int local_600;
  undefined4 uStack_5fc;
  vector<int,_std::allocator<int>_> local_5f8;
  byte local_5d2;
  allocator<int> local_5d1;
  vector<int,_std::allocator<int>_> local_5d0;
  TasGrid local_5b8 [128];
  vector<double,_std::allocator<double>_> local_538;
  double local_520;
  int local_518;
  undefined4 uStack_514;
  ulong local_510;
  size_t i_3;
  string local_500;
  int local_4e0;
  int local_4dc;
  double local_4d8;
  int local_4d0;
  undefined4 uStack_4cc;
  TasmanianSparseGrid local_4c8 [128];
  undefined1 local_448 [8];
  CustomTabulated custom;
  size_t i_2;
  TasmanianSparseGrid grid_copy;
  string local_330;
  int local_310;
  int local_30c;
  double local_308;
  int local_300;
  undefined4 uStack_2fc;
  vector<int,_std::allocator<int>_> local_2f8;
  vector<int,_std::allocator<int>_> local_2d8;
  TasGrid local_2b8 [135];
  allocator<double> local_231;
  value_type_conflict1 local_230;
  vector<double,_std::allocator<double>_> local_228;
  allocator<double> local_209;
  value_type_conflict1 local_208;
  vector<double,_std::allocator<double>_> local_200;
  vector<int,_std::allocator<int>_> local_1e8;
  vector<int,_std::allocator<int>_> local_1c8;
  TasGrid local_1b0 [128];
  ulong local_130;
  size_t i_1;
  int *piStack_120;
  int num_fn_outputs;
  char *custom_filename;
  int local_110;
  bool bPass;
  int i;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> x;
  TypeDepth type;
  size_t num_global_tests;
  TestResults R;
  TasmanianSparseGrid grid;
  int *depths_local;
  vector<TestType,_std::allocator<TestType>_> *tests_local;
  double beta_local;
  double alpha_local;
  int *anisotropic_local;
  TypeOneDRule rule_local;
  BaseFunction *f_local;
  ExternalTester *this_local;
  
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&R.num_points);
  sVar10 = std::vector<TestType,_std::allocator<TestType>_>::size(tests);
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (uint)(rule != rule_fourier) * 3 + type_level;
  iVar5 = (**f->_vptr_BaseFunction)();
  genRandom((vector<double,_std::allocator<double>_> *)local_100,iVar5,1);
  if (rule == rule_fourier) {
    for (local_110 = 0; iVar5 = local_110, iVar6 = (**f->_vptr_BaseFunction)(), iVar5 < iVar6;
        local_110 = local_110 + 1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_100,(long)local_110);
      dVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_100,(long)local_110);
      *pvVar11 = (dVar1 + 1.0) * 0.5;
    }
  }
  custom_filename._7_1_ = 1;
  if (rule == rule_customtabulated) {
    local_668 = (int *)findGaussPattersonTable();
  }
  else {
    local_668 = (int *)0x0;
  }
  piStack_120 = local_668;
  bVar3 = std::operator==(tests,&this->quad_only);
  if (bVar3) {
    local_670 = 0;
  }
  else {
    local_670 = (*f->_vptr_BaseFunction[1])();
  }
  i_1._4_4_ = local_670;
  for (local_130 = 0; local_130 < sVar10; local_130 = local_130 + 1) {
    if (rule == rule_fourier) {
      if (anisotropic == (int *)0x0) {
        iVar7 = (**f->_vptr_BaseFunction)();
        TVar2 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
        iVar6 = i_1._4_4_;
        iVar5 = depths[local_130];
        local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_1c8);
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_1e8);
        TasGrid::makeFourierGrid(local_1b0,iVar7,iVar6,iVar5,TVar2,&local_1c8,&local_1e8);
        TasGrid::TasmanianSparseGrid::operator=
                  ((TasmanianSparseGrid *)&R.num_points,(TasmanianSparseGrid *)local_1b0);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_1b0);
        std::vector<int,_std::allocator<int>_>::~vector(&local_1e8);
        std::vector<int,_std::allocator<int>_>::~vector(&local_1c8);
      }
      else {
        iVar5 = (**f->_vptr_BaseFunction)();
        TasGrid::TasmanianSparseGrid::makeFourierGrid
                  ((int)&R + 8,iVar5,i_1._4_4_,depths[local_130],
                   (int *)(ulong)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_,anisotropic);
      }
      iVar5 = TasGrid::TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)&R.num_points);
      local_208 = -1.0;
      std::allocator<double>::allocator(&local_209);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_200,(long)iVar5,&local_208,&local_209);
      iVar5 = TasGrid::TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)&R.num_points);
      local_230 = 1.0;
      std::allocator<double>::allocator(&local_231);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_228,(long)iVar5,&local_230,&local_231);
      TasGrid::TasmanianSparseGrid::setDomainTransform((vector *)&R.num_points,(vector *)&local_200)
      ;
      std::vector<double,_std::allocator<double>_>::~vector(&local_228);
      std::allocator<double>::~allocator(&local_231);
      std::vector<double,_std::allocator<double>_>::~vector(&local_200);
      std::allocator<double>::~allocator(&local_209);
    }
    else if (anisotropic == (int *)0x0) {
      iVar7 = (**f->_vptr_BaseFunction)();
      TVar2 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
      iVar6 = i_1._4_4_;
      iVar5 = depths[local_130];
      local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_2d8);
      custom_filename_00 = piStack_120;
      local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector(&local_2f8);
      TasGrid::makeGlobalGrid
                (local_2b8,iVar7,iVar6,iVar5,TVar2,rule,&local_2d8,alpha,beta,
                 (char *)custom_filename_00,&local_2f8);
      TasGrid::TasmanianSparseGrid::operator=
                ((TasmanianSparseGrid *)&R.num_points,(TasmanianSparseGrid *)local_2b8);
      TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_2b8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_2f8);
      std::vector<int,_std::allocator<int>_>::~vector(&local_2d8);
    }
    else {
      iVar5 = (**f->_vptr_BaseFunction)();
      TasGrid::TasmanianSparseGrid::makeGlobalGrid
                ((int)&R + 8,iVar5,i_1._4_4_,depths[local_130],
                 x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_,(int *)(ulong)rule,alpha,beta,
                 (char *)anisotropic,piStack_120);
    }
    pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[](tests,local_130);
    TVar16 = getError(this,f,(TasmanianSparseGrid *)&R.num_points,*pvVar12,
                      (vector<double,_std::allocator<double>_> *)local_100);
    local_300 = TVar16.num_points;
    dVar1 = TVar16.error;
    R.error = (double)CONCAT44(uStack_2fc,local_300);
    local_308 = dVar1;
    if (tols[local_130] <= dVar1 && dVar1 != tols[local_130]) {
      custom_filename._7_1_ = 0;
      local_30c = (int)std::setw(0x12);
      poVar13 = std::operator<<((ostream *)&std::cout,(_Setw)local_30c);
      poVar13 = std::operator<<(poVar13,"ERROR: FAILED ");
      pcVar15 = "global";
      if (rule == rule_fourier) {
        pcVar15 = "fourier";
      }
      poVar13 = std::operator<<(poVar13,pcVar15);
      local_310 = (int)std::setw(0x19);
      poVar13 = std::operator<<(poVar13,(_Setw)local_310);
      TasGrid::IO::getRuleString_abi_cxx11_(&local_330,(IO *)(ulong)rule,rule_00);
      std::operator<<(poVar13,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      _Var8 = std::setw(0x19);
      poVar13 = std::operator<<((ostream *)&std::cout,_Var8);
      pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[](tests,local_130);
      pcVar15 = testName(*pvVar12);
      poVar13 = std::operator<<(poVar13,pcVar15);
      poVar13 = std::operator<<(poVar13,"   failed function: ");
      iVar5 = (*f->_vptr_BaseFunction[2])();
      std::operator<<(poVar13,(char *)CONCAT44(extraout_var,iVar5));
      _Var8 = std::setw(10);
      poVar13 = std::operator<<((ostream *)&std::cout,_Var8);
      poVar13 = std::operator<<(poVar13,"  observed: ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,dVar1);
      poVar13 = std::operator<<(poVar13,"  expected: ");
      pvVar14 = (void *)std::ostream::operator<<(poVar13,tols[local_130]);
      std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
    }
  }
  if (rule == rule_customtabulated) {
    TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)&i_2);
    for (custom.description.field_2._8_8_ = 0; (ulong)custom.description.field_2._8_8_ < sVar10 << 1
        ; custom.description.field_2._8_8_ = custom.description.field_2._8_8_ + 1) {
      if ((ulong)custom.description.field_2._8_8_ < sVar10) {
        iVar5 = (**f->_vptr_BaseFunction)();
        TasGrid::TasmanianSparseGrid::makeGlobalGrid
                  ((int)&R + 8,iVar5,i_1._4_4_,depths[custom.description.field_2._8_8_],
                   x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,(int *)0x24,alpha,beta,
                   (char *)anisotropic,piStack_120);
      }
      else {
        TasGrid::CustomTabulated::CustomTabulated((CustomTabulated *)local_448);
        TasGrid::CustomTabulated::read(local_448);
        TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(local_4c8);
        TasGrid::TasmanianSparseGrid::operator=((TasmanianSparseGrid *)&R.num_points,local_4c8);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(local_4c8);
        iVar5 = (**f->_vptr_BaseFunction)();
        TasGrid::TasmanianSparseGrid::makeGlobalGrid
                  ((int)&R + 8,iVar5,i_1._4_4_,
                   depths[(ulong)custom.description.field_2._8_8_ % sVar10],
                   (CustomTabulated *)
                   (ulong)x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,(int *)local_448,
                   anisotropic);
        TasGrid::CustomTabulated::~CustomTabulated((CustomTabulated *)local_448);
      }
      TasGrid::TasmanianSparseGrid::operator=
                ((TasmanianSparseGrid *)&i_2,(TasmanianSparseGrid *)&R.num_points);
      pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[]
                          (tests,(ulong)custom.description.field_2._8_8_ % sVar10);
      TVar16 = getError(this,f,(TasmanianSparseGrid *)&i_2,*pvVar12,
                        (vector<double,_std::allocator<double>_> *)local_100);
      local_4d0 = TVar16.num_points;
      dVar1 = TVar16.error;
      R.error = (double)CONCAT44(uStack_4cc,local_4d0);
      local_4d8 = dVar1;
      if (tols[(ulong)custom.description.field_2._8_8_ % sVar10] <= dVar1 &&
          dVar1 != tols[(ulong)custom.description.field_2._8_8_ % sVar10]) {
        custom_filename._7_1_ = 0;
        local_4dc = (int)std::setw(0x12);
        poVar13 = std::operator<<((ostream *)&std::cout,(_Setw)local_4dc);
        poVar13 = std::operator<<(poVar13,"ERROR: FAILED global");
        local_4e0 = (int)std::setw(0x19);
        poVar13 = std::operator<<(poVar13,(_Setw)local_4e0);
        TasGrid::IO::getRuleString_abi_cxx11_(&local_500,(IO *)0x24,rule_01);
        std::operator<<(poVar13,(string *)&local_500);
        std::__cxx11::string::~string((string *)&local_500);
        i_3._4_4_ = std::setw(0x19);
        poVar13 = std::operator<<((ostream *)&std::cout,i_3._4_4_);
        pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[]
                            (tests,(ulong)custom.description.field_2._8_8_ % sVar10);
        pcVar15 = testName(*pvVar12);
        poVar13 = std::operator<<(poVar13,pcVar15);
        poVar13 = std::operator<<(poVar13,"   failed function: ");
        iVar5 = (*f->_vptr_BaseFunction[2])();
        std::operator<<(poVar13,(char *)CONCAT44(extraout_var_00,iVar5));
        i_3._0_4_ = std::setw(10);
        poVar13 = std::operator<<((ostream *)&std::cout,i_3._0_4_);
        poVar13 = std::operator<<(poVar13,"observed: ");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,dVar1);
        poVar13 = std::operator<<(poVar13,"  expected: ");
        pvVar14 = (void *)std::ostream::operator<<
                                    (poVar13,tols[(ulong)custom.description.field_2._8_8_ % sVar10])
        ;
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      }
    }
    TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&i_2);
  }
  bVar4 = TasGrid::OneDimensionalMeta::isSequence(rule);
  if ((bVar4 & 1) != 0) {
    for (local_510 = 0; local_510 < sVar10; local_510 = local_510 + 1) {
      pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[](tests,local_510);
      if (*pvVar12 == type_integration) {
        iVar5 = (**f->_vptr_BaseFunction)();
        TasGrid::TasmanianSparseGrid::makeSequenceGrid
                  ((int)&R + 8,iVar5,0,depths[local_510],
                   x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_,(int *)(ulong)rule,anisotropic);
        local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_538.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::vector(&local_538);
        TVar16 = getError(this,f,(TasmanianSparseGrid *)&R.num_points,type_integration,&local_538);
        local_518 = TVar16.num_points;
        num_global_tests = (size_t)TVar16.error;
        R.error = (double)CONCAT44(uStack_514,local_518);
        local_520 = (double)num_global_tests;
        std::vector<double,_std::allocator<double>_>::~vector(&local_538);
      }
      else {
        iVar6 = (**f->_vptr_BaseFunction)();
        iVar7 = (*f->_vptr_BaseFunction[1])();
        TVar2 = x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
        iVar5 = depths[local_510];
        local_5d2 = 0;
        if (anisotropic == (int *)0x0) {
          memset(&local_5d0,0,0x18);
          std::vector<int,_std::allocator<int>_>::vector(&local_5d0);
        }
        else {
          iVar9 = (**f->_vptr_BaseFunction)();
          std::allocator<int>::allocator(&local_5d1);
          local_5d2 = 1;
          std::vector<int,std::allocator<int>>::vector<int_const*,void>
                    ((vector<int,std::allocator<int>> *)&local_5d0,anisotropic,anisotropic + iVar9,
                     &local_5d1);
        }
        local_5f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_5f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_5f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::vector(&local_5f8);
        TasGrid::makeSequenceGrid(local_5b8,iVar6,iVar7,iVar5,TVar2,rule,&local_5d0,&local_5f8);
        TasGrid::TasmanianSparseGrid::operator=
                  ((TasmanianSparseGrid *)&R.num_points,(TasmanianSparseGrid *)local_5b8);
        TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)local_5b8);
        std::vector<int,_std::allocator<int>_>::~vector(&local_5f8);
        std::vector<int,_std::allocator<int>_>::~vector(&local_5d0);
        if ((local_5d2 & 1) != 0) {
          std::allocator<int>::~allocator(&local_5d1);
        }
        pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[](tests,local_510);
        TVar16 = getError(this,f,(TasmanianSparseGrid *)&R.num_points,*pvVar12,
                          (vector<double,_std::allocator<double>_> *)local_100);
        local_600 = TVar16.num_points;
        local_608 = TVar16.error;
        R.error = (double)CONCAT44(uStack_5fc,local_600);
        num_global_tests = (size_t)local_608;
      }
      if (tols[local_510] <= (double)num_global_tests && (double)num_global_tests != tols[local_510]
         ) {
        custom_filename._7_1_ = 0;
        local_60c = (int)std::setw(0x12);
        poVar13 = std::operator<<((ostream *)&std::cout,(_Setw)local_60c);
        poVar13 = std::operator<<(poVar13,"ERROR: FAILED sequence");
        local_610 = (int)std::setw(0x19);
        poVar13 = std::operator<<(poVar13,(_Setw)local_610);
        TasGrid::IO::getRuleString_abi_cxx11_(&local_630,(IO *)(ulong)rule,rule_02);
        std::operator<<(poVar13,(string *)&local_630);
        std::__cxx11::string::~string((string *)&local_630);
        _Var8 = std::setw(0x19);
        poVar13 = std::operator<<((ostream *)&std::cout,_Var8);
        pvVar12 = std::vector<TestType,_std::allocator<TestType>_>::operator[](tests,local_510);
        pcVar15 = testName(*pvVar12);
        poVar13 = std::operator<<(poVar13,pcVar15);
        poVar13 = std::operator<<(poVar13,"   failed function: ");
        iVar5 = (*f->_vptr_BaseFunction[2])();
        std::operator<<(poVar13,(char *)CONCAT44(extraout_var_01,iVar5));
        _Var8 = std::setw(10);
        poVar13 = std::operator<<((ostream *)&std::cout,_Var8);
        poVar13 = std::operator<<(poVar13,"  observed: ");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,(double)num_global_tests);
        poVar13 = std::operator<<(poVar13,"  expected: ");
        pvVar14 = (void *)std::ostream::operator<<(poVar13,tols[local_510]);
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  bVar4 = custom_filename._7_1_;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_100);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid((TasmanianSparseGrid *)&R.num_points);
  return (bool)(bVar4 & 1);
}

Assistant:

bool ExternalTester::testGlobalRule(const BaseFunction *f, TasGrid::TypeOneDRule rule, const int *anisotropic, double alpha, double beta, const std::vector<TestType> &tests, const int depths[], const double tols[]) const{
    TasGrid::TasmanianSparseGrid grid;
    TestResults R;
    size_t num_global_tests = tests.size();
    TasGrid::TypeDepth type = (rule == rule_fourier ? TasGrid::type_level : TasGrid::type_iptotal);
    std::vector<double> x = genRandom(f->getNumInputs());
    if (rule == rule_fourier){ for(int i=0; i<f->getNumInputs(); i++) x[i] = 0.5*(x[i]+1.0); }    // map to canonical [0,1]^d
    bool bPass = true;
    const char *custom_filename = (rule == rule_customtabulated) ? findGaussPattersonTable() : 0;
    int num_fn_outputs = (tests == quad_only) ? 0 : f->getNumOutputs();
    for(size_t i=0; i<num_global_tests; i++){
        if (rule == rule_fourier){
            if (anisotropic == nullptr){
                grid = makeFourierGrid(f->getNumInputs(), num_fn_outputs, depths[i], type);
            }else{
                grid.makeFourierGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, anisotropic);
            }
            grid.setDomainTransform(std::vector<double>(grid.getNumDimensions(), -1.0), std::vector<double>(grid.getNumDimensions(), 1.0));
        }else{
            if (anisotropic == nullptr){
                grid = makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, std::vector<int>(), alpha, beta, custom_filename);
            }else{
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, anisotropic, alpha, beta, custom_filename);
            }
        }
        R = getError(f, grid, tests[i], x);
        if (R.error > tols[i]){
            bPass = false;
            cout << setw(18) << "ERROR: FAILED " << (rule == rule_fourier ? "fourier" : "global") << setw(25) << IO::getRuleString(rule);
            cout << setw(25) << testName(tests[i]) << "   failed function: " << f->getDescription();
            cout << setw(10) << "  observed: " << R.error << "  expected: " << tols[i] << endl;
        }
    }
    if (rule == rule_customtabulated){
        TasGrid::TasmanianSparseGrid grid_copy;
        for(size_t i=0; i<2*num_global_tests; i++){
            if (i < num_global_tests){
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i], type, rule, anisotropic, alpha, beta, custom_filename);
            }else{
                CustomTabulated custom;
                custom.read(custom_filename);
                grid = TasmanianSparseGrid();
                grid.makeGlobalGrid(f->getNumInputs(), num_fn_outputs, depths[i % num_global_tests], type, std::move(custom), anisotropic);
            }
            grid_copy = grid;
            R = getError(f, grid_copy, tests[i % num_global_tests], x);
            if (R.error > tols[i % num_global_tests]){
                bPass = false;
                cout << setw(18) << "ERROR: FAILED global" << setw(25) << IO::getRuleString(rule);
                cout << setw(25) << testName(tests[i % num_global_tests]) << "   failed function: " << f->getDescription();
                cout << setw(10) << "observed: " << R.error << "  expected: " << tols[i % num_global_tests] << endl;
            }
        }
    }

    if (TasGrid::OneDimensionalMeta::isSequence(rule)){
        for(size_t i=0; i<num_global_tests; i++){
            if (tests[i] == type_integration){
                grid.makeSequenceGrid(f->getNumInputs(), 0, depths[i], type, rule, anisotropic);
                R = getError(f, grid, type_integration);
            }else{
                grid = makeSequenceGrid(f->getNumInputs(), f->getNumOutputs(), depths[i], type, rule,
                                        (anisotropic != nullptr) ? std::vector<int>(anisotropic, anisotropic + f->getNumInputs()) : std::vector<int>());
                R = getError(f, grid, tests[i], x);
            }
            if (R.error > tols[i]){
                bPass = false;
                cout << setw(18) << "ERROR: FAILED sequence" << setw(25) << IO::getRuleString(rule);
                cout << setw(25) << testName(tests[i]) << "   failed function: " << f->getDescription();
                cout << setw(10) << "  observed: " << R.error << "  expected: " << tols[i] << endl;
            }
        }
    }
    return bPass;
}